

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

Vec_Wec_t * Mop_ManCubeCount(Mop_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *p_00;
  word *p_01;
  word *pCube;
  Vec_Wec_t *vOuts;
  int local_18;
  int iCube;
  int k;
  int i;
  Mop_Man_t *p_local;
  
  p_00 = Vec_WecStart(p->nOuts);
  for (iCube = 0; iVar1 = Vec_IntSize(p->vCubes), iCube < iVar1; iCube = iCube + 1) {
    iVar1 = Vec_IntEntry(p->vCubes,iCube);
    if (iVar1 != -1) {
      p_01 = Mop_ManCubeOut(p,iVar1);
      for (local_18 = 0; local_18 < p->nOuts; local_18 = local_18 + 1) {
        iVar2 = Abc_TtGetBit(p_01,local_18);
        if (iVar2 != 0) {
          Vec_WecPush(p_00,local_18,iVar1);
        }
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Wec_t * Mop_ManCubeCount( Mop_Man_t * p )
{
    int i, k, iCube;
    Vec_Wec_t * vOuts = Vec_WecStart( p->nOuts );
    Vec_IntForEachEntry( p->vCubes, iCube, i )
    if ( iCube != -1 )
    {
        word * pCube = Mop_ManCubeOut( p, iCube );
        for ( k = 0; k < p->nOuts; k++ )
            if ( Abc_TtGetBit( pCube, k ) )
                Vec_WecPush( vOuts, k, iCube );
    }
    return vOuts;
}